

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QAction * __thiscall
QMenu::addAction(QMenu *this,QIcon *icon,QString *text,QObject *receiver,char *member,
                QKeySequence *shortcut)

{
  QAction *this_00;
  char *in_RCX;
  QString *in_RDX;
  QIcon *in_RSI;
  QObject *in_RDI;
  ConnectionType in_R8D;
  long in_FS_OFFSET;
  QAction *action;
  QKeySequence *action_00;
  QWidget *this_01;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  QAction::QAction(this_00,in_RSI,in_RDX,in_RDI);
  action_00 = (QKeySequence *)this_00;
  QAction::setShortcut((QKeySequence *)this_00);
  this_01 = (QWidget *)&stack0xfffffffffffffff0;
  QObject::connect((QObject *)this_01,(char *)this_00,(QObject *)"2triggered(bool)",in_RCX,in_R8D);
  QMetaObject::Connection::~Connection((Connection *)this_01);
  QWidget::addAction(this_01,(QAction *)action_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenu::addAction(const QIcon &icon, const QString &text, const QObject *receiver,
                          const char* member, const QKeySequence &shortcut)
{
    QAction *action = new QAction(icon, text, this);
    action->setShortcut(shortcut);
    QObject::connect(action, SIGNAL(triggered(bool)), receiver, member);
    addAction(action);
    return action;
}